

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O2

string * __thiscall
ApprovalTests::ApprovalTestNamer::getSourceFileName_abi_cxx11_
          (string *__return_storage_ptr__,ApprovalTestNamer *this)

{
  TestName *pTVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fileName;
  string file;
  
  pTVar1 = getCurrentTest();
  TestName::checkBuildConfiguration(&pTVar1->fileName);
  ::std::__cxx11::string::string((string *)&file,(string *)&pTVar1->fileName);
  SystemUtils::getDirectorySeparator_abi_cxx11_();
  ::std::__cxx11::string::rfind((string *)&file,(ulong)&fileName);
  ::std::__cxx11::string::~string((string *)&fileName);
  ::std::__cxx11::string::rfind((char)&file,0x2e);
  ::std::__cxx11::string::substr((ulong)&fileName,(ulong)&file);
  convertToFileName(__return_storage_ptr__,&fileName);
  ::std::__cxx11::string::~string((string *)&fileName);
  ::std::__cxx11::string::~string((string *)&file);
  return __return_storage_ptr__;
}

Assistant:

std::string ApprovalTestNamer::getSourceFileName() const
    {
        auto file = getCurrentTest().getFileName();
        auto start = file.rfind(SystemUtils::getDirectorySeparator()) + 1;
        auto end = file.rfind('.');
        auto fileName = file.substr(start, end - start);
        return convertToFileName(fileName);
    }